

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

void __thiscall
QShortcutEvent::QShortcutEvent
          (QShortcutEvent *this,QKeySequence *key,QShortcut *shortcut,bool ambiguous)

{
  byte bVar1;
  QObjectPrivate *file;
  QList<int> *this_00;
  QDebug *o;
  const_reference piVar2;
  byte in_CL;
  QDebug *in_RDX;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  qsizetype index;
  QShortcutPrivate *priv;
  QListSpecialMethodsBase<QKeySequence> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  QEvent *p;
  QDebug *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd8;
  QDebug local_20;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  p = in_RDI;
  QEvent::QEvent(in_RDI,Shortcut);
  *(undefined ***)in_RDI = &PTR__QShortcutEvent_00e15dc8;
  QKeySequence::QKeySequence((QKeySequence *)in_stack_ffffffffffffff90,(QKeySequence *)in_RDI);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  in_RDI[0x1c] = (QEvent)(bVar1 & 1);
  if (in_RDX != (QDebug *)0x0) {
    file = QObjectPrivate::get((QObject *)0x34f91b);
    this_00 = (QList<int> *)
              QListSpecialMethodsBase<QKeySequence>::indexOf<QKeySequence>
                        (in_stack_ffffffffffffff90,(QKeySequence *)in_RDI,0x34f937);
    if ((long)this_00 < 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(bVar1,in_stack_ffffffffffffffa0),(char *)file,
                 (int)((ulong)this_00 >> 0x20),(char *)in_RDI);
      QMessageLogger::warning();
      o = QDebug::operator<<(in_RDX,in_stack_ffffffffffffffd8);
      QDebug::QDebug(&local_18,o);
      ::operator<<(in_stack_ffffffffffffffc0,(QKeySequence *)p);
      QDebug::~QDebug(&local_10);
      QDebug::~QDebug(&local_18);
      QDebug::~QDebug(&local_20);
    }
    else {
      piVar2 = QList<int>::operator[](this_00,(qsizetype)in_RDI);
      *(int *)(in_RDI + 0x18) = *piVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QShortcutEvent::QShortcutEvent(const QKeySequence &key, const QShortcut *shortcut, bool ambiguous)
    : QEvent(Shortcut), m_sequence(key), m_shortcutId(0), m_ambiguous(ambiguous)
{
    if (shortcut) {
        auto priv = static_cast<const QShortcutPrivate *>(QShortcutPrivate::get(shortcut));
        auto index = priv->sc_sequences.indexOf(key);
        if (index < 0) {
            qWarning() << "Given QShortcut does not contain key-sequence " << key;
            return;
        }
        m_shortcutId = priv->sc_ids[index];
    }
}